

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_serialize_field
          (t_c_glib_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix,
          int error_ret)

{
  t_c_glib_generator *this_00;
  int iVar1;
  t_type *ttype;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  logic_error *this_01;
  t_struct *tstruct;
  char *pcVar4;
  string *this_02;
  t_base_type *this_03;
  undefined1 auVar5 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  t_c_glib_generator *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = this;
  ttype = t_type::get_true_type(tfield->type_);
  std::operator+(&local_f8,prefix,&tfield->name_);
  std::operator+(&name,&local_f8,suffix);
  std::__cxx11::string::~string((string *)&local_f8);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  this_00 = local_d8;
  if ((char)iVar1 != '\0') {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar3,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&name);
    __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar1 != '\0') ||
     (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar1 != '\0')) {
    std::__cxx11::string::string((string *)&local_90,(string *)&name);
    generate_serialize_struct(this_00,out,tstruct,&local_90,error_ret);
    this_02 = &local_90;
    goto LAB_0015e496;
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar1 != '\0') {
    std::__cxx11::string::string((string *)&local_b0,(string *)&name);
    generate_serialize_container(this_00,out,ttype,&local_b0,error_ret);
    this_02 = &local_b0;
    goto LAB_0015e496;
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar1 == '\0')) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"DO NOT KNOW HOW TO SERIALIZE FIELD \'",&name);
    std::operator+(&local_d0,&local_50,"\' TYPE \'");
    type_name_abi_cxx11_(&local_70,local_d8,ttype,false,false);
    std::operator+(&local_f8,&local_d0,&local_70);
    std::logic_error::logic_error(this_01,(string *)&local_f8);
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  poVar2 = t_generator::indent((t_generator *)this_00,out);
  std::operator<<(poVar2,"if ((ret = thrift_protocol_write_");
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    poVar2 = std::operator<<(out,"i32 (protocol, (gint32) ");
    std::operator<<(poVar2,(string *)&name);
  }
  else {
    this_03 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
    switch(this_03) {
    case (t_base_type *)0x0:
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::operator+(pbVar3,"compiler error: cannot serialize void field in a struct: ",&name);
      __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case (t_base_type *)0x1:
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
      if ((char)iVar1 != '\0') {
        poVar2 = std::operator<<(out,"binary (protocol, ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2," ? ((GByteArray *) ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2,")->data : NULL, ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        poVar2 = std::operator<<(poVar2," ? ((GByteArray *) ");
        poVar2 = std::operator<<(poVar2,(string *)&name);
        std::operator<<(poVar2,")->len : 0");
        goto LAB_0015e65e;
      }
      pcVar4 = "string (protocol, ";
      break;
    case (t_base_type *)0x2:
      pcVar4 = "bool (protocol, ";
      break;
    case (t_base_type *)0x3:
      pcVar4 = "byte (protocol, ";
      break;
    case (t_base_type *)0x4:
      pcVar4 = "i16 (protocol, ";
      break;
    case (t_base_type *)0x5:
      pcVar4 = "i32 (protocol, ";
      break;
    case (t_base_type *)0x6:
      pcVar4 = "i64 (protocol, ";
      break;
    case (t_base_type *)0x7:
      pcVar4 = "double (protocol, ";
      break;
    default:
      auVar5 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_d0,this_03,auVar5._8_4_);
      std::operator+(&local_f8,"compiler error: no C writer for base type ",&local_d0);
      std::operator+(auVar5._0_8_,&local_f8,&name);
      __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    poVar2 = std::operator<<(out,pcVar4);
    std::operator<<(poVar2,(string *)&name);
  }
LAB_0015e65e:
  poVar2 = std::operator<<(out,", error)) < 0)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_f8);
  poVar2 = std::operator<<(poVar2,"  return ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,error_ret);
  poVar2 = std::operator<<(poVar2,";");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,"xfer += ret;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  this_02 = &local_f8;
LAB_0015e496:
  std::__cxx11::string::~string((string *)this_02);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_field(ostream& out,
                                                  t_field* tfield,
                                                  string prefix,
                                                  string suffix,
                                                  int error_ret) {
  t_type* type = get_true_type(tfield->get_type());
  string name = prefix + tfield->get_name() + suffix;

  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name, error_ret);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name, error_ret);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << "if ((ret = thrift_protocol_write_";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_BOOL:
        out << "bool (protocol, " << name;
        break;
      case t_base_type::TYPE_I8:
        out << "byte (protocol, " << name;
        break;
      case t_base_type::TYPE_I16:
        out << "i16 (protocol, " << name;
        break;
      case t_base_type::TYPE_I32:
        out << "i32 (protocol, " << name;
        break;
      case t_base_type::TYPE_I64:
        out << "i64 (protocol, " << name;
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "double (protocol, " << name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "binary (protocol, " << name << " ? ((GByteArray *) " << name << ")->data : NULL, "
              << name << " ? ((GByteArray *) " << name << ")->len : 0";
        } else {
          out << "string (protocol, " << name;
        }
        break;
      default:
        throw "compiler error: no C writer for base type " + t_base_type::t_base_name(tbase) + name;
      }
    } else {
      out << "i32 (protocol, (gint32) " << name;
    }
    out << ", error)) < 0)" << endl
        << indent() << "  return " << error_ret << ";" << endl
        << indent() << "xfer += ret;" << endl << endl;
  } else {
    throw std::logic_error("DO NOT KNOW HOW TO SERIALIZE FIELD '" + name + "' TYPE '"
                           + type_name(type));
  }
}